

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Format.cpp
# Opt level: O2

bool Format::FromSize(int64_t size,Format *fmt)

{
  RegularFormat RVar1;
  Format local_4c;
  
  if (size == 0x2d0000) {
    RVar1 = PC2880;
LAB_00168671:
    Format(&local_4c,RVar1);
    *(ulong *)((long)&fmt->skew + 2) = CONCAT26((undefined2)local_4c.head1,local_4c._42_6_);
    *(undefined8 *)((long)&fmt->head1 + 2) = local_4c._50_8_;
    fmt->offset = local_4c.offset;
    fmt->interleave = local_4c.interleave;
    fmt->skew = (int)CONCAT62(local_4c._42_6_,(undefined2)local_4c.skew);
    fmt->head0 = local_4c.head0;
    fmt->encoding = local_4c.encoding;
    fmt->sectors = local_4c.sectors;
    fmt->size = local_4c.size;
    fmt->base = local_4c.base;
    fmt->cyls = local_4c.cyls;
    fmt->heads = local_4c.heads;
    fmt->fdc = local_4c.fdc;
    fmt->datarate = local_4c.datarate;
  }
  else {
    if (size == 0x28000) {
      RVar1 = PC320;
    }
    else {
      if (size != 0x2d000) {
        if (size == 0x50000) {
          RVar1 = PC320;
        }
        else if (size == 0x5a000) {
          RVar1 = PC360;
        }
        else if (size == 0xa0000) {
          RVar1 = PC640;
        }
        else if (size == 0xb4000) {
          RVar1 = PC720;
        }
        else if (size == 0xc8000) {
          RVar1 = MGT;
        }
        else if ((char *)size ==
                 "emplace_hint_uniqueIJRKSt21piecewise_construct_tSt5tupleIJRS2_EESE_IJEEEEESt17_Rb_tree_iteratorIS3_ESt23_Rb_tree_const_iteratorIS3_EDpOT_"
                ) {
          RVar1 = PC1200;
        }
        else if ((char *)size == "0Ev") {
          RVar1 = PC1232;
        }
        else {
          if (size != 0x168000) {
            if (size == 0x190000) {
              Format(&local_4c,PC1440);
              *(ulong *)((long)&fmt->skew + 2) =
                   CONCAT26((undefined2)local_4c.head1,local_4c._42_6_);
              *(undefined8 *)((long)&fmt->head1 + 2) = local_4c._50_8_;
              fmt->offset = local_4c.offset;
              fmt->interleave = local_4c.interleave;
              fmt->skew = (int)CONCAT62(local_4c._42_6_,(undefined2)local_4c.skew);
              fmt->head0 = local_4c.head0;
              fmt->encoding = local_4c.encoding;
              fmt->sectors = local_4c.sectors;
              fmt->size = local_4c.size;
              fmt->base = local_4c.base;
              fmt->cyls = local_4c.cyls;
              fmt->heads = local_4c.heads;
              fmt->fdc = local_4c.fdc;
              fmt->datarate = local_4c.datarate;
              fmt->sectors = 0x14;
              goto LAB_00168660;
            }
            if (size == 0x1a4000) {
              Format(&local_4c,PC1440);
              *(ulong *)((long)&fmt->skew + 2) =
                   CONCAT26((undefined2)local_4c.head1,local_4c._42_6_);
              *(undefined8 *)((long)&fmt->head1 + 2) = local_4c._50_8_;
              fmt->offset = local_4c.offset;
              fmt->interleave = local_4c.interleave;
              fmt->skew = (int)CONCAT62(local_4c._42_6_,(undefined2)local_4c.skew);
              fmt->head0 = local_4c.head0;
              fmt->encoding = local_4c.encoding;
              fmt->sectors = local_4c.sectors;
              fmt->size = local_4c.size;
              fmt->base = local_4c.base;
              fmt->cyls = local_4c.cyls;
              fmt->heads = local_4c.heads;
              fmt->fdc = local_4c.fdc;
              fmt->datarate = local_4c.datarate;
            }
            else if (size == 0x1ae800) {
              Format(&local_4c,PC1440);
              *(ulong *)((long)&fmt->skew + 2) =
                   CONCAT26((undefined2)local_4c.head1,local_4c._42_6_);
              *(undefined8 *)((long)&fmt->head1 + 2) = local_4c._50_8_;
              fmt->offset = local_4c.offset;
              fmt->interleave = local_4c.interleave;
              fmt->skew = (int)CONCAT62(local_4c._42_6_,(undefined2)local_4c.skew);
              fmt->head0 = local_4c.head0;
              fmt->encoding = local_4c.encoding;
              fmt->sectors = local_4c.sectors;
              fmt->size = local_4c.size;
              fmt->base = local_4c.base;
              fmt->cyls = local_4c.cyls;
              fmt->heads = local_4c.heads;
              fmt->fdc = local_4c.fdc;
              fmt->datarate = local_4c.datarate;
              fmt->cyls = 0x52;
            }
            else {
              if ((uleb128 *)size != &uleb128_001b3c00) {
                if (size == 0x1b8000) {
                  Format(&local_4c,PC1440);
                  *(ulong *)((long)&fmt->skew + 2) =
                       CONCAT26((undefined2)local_4c.head1,local_4c._42_6_);
                  *(undefined8 *)((long)&fmt->head1 + 2) = local_4c._50_8_;
                  fmt->offset = local_4c.offset;
                  fmt->interleave = local_4c.interleave;
                  fmt->skew = (int)CONCAT62(local_4c._42_6_,(undefined2)local_4c.skew);
                  fmt->head0 = local_4c.head0;
                  fmt->encoding = local_4c.encoding;
                  fmt->sectors = local_4c.sectors;
                  fmt->size = local_4c.size;
                  fmt->base = local_4c.base;
                  fmt->cyls = local_4c.cyls;
                  fmt->heads = local_4c.heads;
                  fmt->fdc = local_4c.fdc;
                  fmt->datarate = local_4c.datarate;
                  fmt->sectors = 0x16;
                  goto LAB_00168660;
                }
                if ((uleb128 *)size == &uleb128_001cc000) {
                  Format(&local_4c,PC1440);
                  *(ulong *)((long)&fmt->skew + 2) =
                       CONCAT26((undefined2)local_4c.head1,local_4c._42_6_);
                  *(undefined8 *)((long)&fmt->head1 + 2) = local_4c._50_8_;
                  fmt->offset = local_4c.offset;
                  fmt->interleave = local_4c.interleave;
                  fmt->skew = (int)CONCAT62(local_4c._42_6_,(undefined2)local_4c.skew);
                  fmt->head0 = local_4c.head0;
                  fmt->encoding = local_4c.encoding;
                  fmt->sectors = local_4c.sectors;
                  fmt->size = local_4c.size;
                  fmt->base = local_4c.base;
                  fmt->cyls = local_4c.cyls;
                  fmt->heads = local_4c.heads;
                  fmt->fdc = local_4c.fdc;
                  fmt->datarate = local_4c.datarate;
                  fmt->sectors = 0x17;
                  goto LAB_00168660;
                }
                if (size == 0x1e0000) {
                  Format(&local_4c,PC1440);
                  *(ulong *)((long)&fmt->skew + 2) =
                       CONCAT26((undefined2)local_4c.head1,local_4c._42_6_);
                  *(undefined8 *)((long)&fmt->head1 + 2) = local_4c._50_8_;
                  fmt->offset = local_4c.offset;
                  fmt->interleave = local_4c.interleave;
                  fmt->skew = (int)CONCAT62(local_4c._42_6_,(undefined2)local_4c.skew);
                  fmt->head0 = local_4c.head0;
                  fmt->encoding = local_4c.encoding;
                  fmt->sectors = local_4c.sectors;
                  fmt->size = local_4c.size;
                  fmt->base = local_4c.base;
                  fmt->cyls = local_4c.cyls;
                  fmt->heads = local_4c.heads;
                  fmt->fdc = local_4c.fdc;
                  fmt->datarate = local_4c.datarate;
                  fmt->sectors = 0x18;
                  goto LAB_00168660;
                }
                if (size != 0x23000) {
                  return false;
                }
                RVar1 = DO;
                goto LAB_00168671;
              }
              Format(&local_4c,PC1440);
              *(ulong *)((long)&fmt->skew + 2) =
                   CONCAT26((undefined2)local_4c.head1,local_4c._42_6_);
              *(undefined8 *)((long)&fmt->head1 + 2) = local_4c._50_8_;
              fmt->offset = local_4c.offset;
              fmt->interleave = local_4c.interleave;
              fmt->skew = (int)CONCAT62(local_4c._42_6_,(undefined2)local_4c.skew);
              fmt->head0 = local_4c.head0;
              fmt->encoding = local_4c.encoding;
              fmt->sectors = local_4c.sectors;
              fmt->size = local_4c.size;
              fmt->base = local_4c.base;
              fmt->cyls = local_4c.cyls;
              fmt->heads = local_4c.heads;
              fmt->fdc = local_4c.fdc;
              fmt->datarate = local_4c.datarate;
              fmt->cyls = 0x53;
            }
            fmt->sectors = 0x15;
LAB_00168660:
            fmt->gap3 = 0;
            return true;
          }
          RVar1 = PC1440;
        }
        goto LAB_00168671;
      }
      RVar1 = PC360;
    }
    Format(&local_4c,RVar1);
    *(ulong *)((long)&fmt->skew + 2) = CONCAT26((undefined2)local_4c.head1,local_4c._42_6_);
    *(undefined8 *)((long)&fmt->head1 + 2) = local_4c._50_8_;
    fmt->offset = local_4c.offset;
    fmt->interleave = local_4c.interleave;
    fmt->skew = (int)CONCAT62(local_4c._42_6_,(undefined2)local_4c.skew);
    fmt->head0 = local_4c.head0;
    fmt->encoding = local_4c.encoding;
    fmt->sectors = local_4c.sectors;
    fmt->size = local_4c.size;
    fmt->base = local_4c.base;
    fmt->cyls = local_4c.cyls;
    fmt->heads = local_4c.heads;
    fmt->fdc = local_4c.fdc;
    fmt->datarate = local_4c.datarate;
    fmt->heads = 1;
  }
  return true;
}

Assistant:

bool Format::FromSize(int64_t size, Format& fmt)
{
    switch (size)
    {
    case 143360:    // Apple ][
        fmt = RegularFormat::DO;
        break;

    case 163840:    // 5.25" SSSD (160K)
        fmt = RegularFormat::PC320;
        fmt.heads = 1;
        break;

    case 184320:    // 5.25" SSSD (180K)
        fmt = RegularFormat::PC360;
        fmt.heads = 1;
        break;

    case 327680:    // 5.25" DSDD (320K)
        fmt = RegularFormat::PC320;
        break;

    case 368640:    // 5.25" DSDD (360K)
        fmt = RegularFormat::PC360;
        break;

    case 655360:    // 3.5"  DSDD (640K)
        fmt = RegularFormat::PC640;
        break;

    case 737280:    // 3.5"  DSDD (720K)
        fmt = RegularFormat::PC720;
        break;

    case 819200:    // MGT (800K), for legacy matching.
        fmt = RegularFormat::MGT;
        break;

    case 1228800:   // 5.25" DSHD (1200K)
        fmt = RegularFormat::PC1200;
        break;

    case 1261568:   // 5.25" DSHD (1232K)
        fmt = RegularFormat::PC1232;
        break;

    case 1474560:   // 3.5"  DSHD (1440K)
        fmt = RegularFormat::PC1440;
        break;

    case 1638400:   // 3.5"  DSHD (1600K)
        fmt = RegularFormat::PC1440;
        fmt.sectors = 20;
        fmt.gap3 = 0;
        break;

    case 1720320:   // 3.5"  DSHD (1680K)
        fmt = RegularFormat::PC1440;
        fmt.sectors = 21;
        fmt.gap3 = 0;
        break;

    case 1763328:   // 3.5"  DSHD (1722K)
        fmt = RegularFormat::PC1440;
        fmt.cyls = 82;
        fmt.sectors = 21;
        fmt.gap3 = 0;
        break;

    case 1784832:   // 3.5"  DSHD (1743K)
        fmt = RegularFormat::PC1440;
        fmt.cyls = 83;
        fmt.sectors = 21;
        fmt.gap3 = 0;
        break;

    case 1802240:   // 3.5"  DSHD (1760K)
        fmt = RegularFormat::PC1440;
        fmt.sectors = 22;
        fmt.gap3 = 0;
        break;

    case 1884160:   // 3.5"  DSHD (1840K)
        fmt = RegularFormat::PC1440;
        fmt.sectors = 23;
        fmt.gap3 = 0;
        break;

    case 1966080:   // 3.5"  DSHD (1920K)
        fmt = RegularFormat::PC1440;
        fmt.sectors = 24;
        fmt.gap3 = 0;
        break;

    case 2949120:   // 3.5"  DSED (2880K)
        fmt = RegularFormat::PC2880;
        break;

    default:
        return false;
    }

    return true;
}